

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O2

float tansig_approx(float x)

{
  float fVar1;
  float fVar2;
  float fVar3;
  
  if (8.0 <= x) {
    return 1.0;
  }
  if (-8.0 < x) {
    fVar3 = -x;
    fVar2 = fVar3;
    if (fVar3 <= x) {
      fVar2 = x;
    }
    fVar1 = floorf(fVar2 * 25.0 + 0.5);
    fVar2 = (float)(int)fVar1 * -0.04 + fVar2;
    fVar1 = tansig_table[(int)fVar1];
    fVar1 = (1.0 - fVar2 * fVar1) * (1.0 - fVar1 * fVar1) * fVar2 + fVar1;
    return (float)(-(uint)(x < fVar3) & (uint)-fVar1 | ~-(uint)(x < fVar3) & (uint)fVar1);
  }
  return -1.0;
}

Assistant:

static OPUS_INLINE float tansig_approx(float x) {
    int i;
    float y, dy;
    float sign = 1;
    /* Tests are reversed to catch NaNs */
    if (!(x < 8)) return 1;
    if (!(x > -8)) return -1;
#ifndef FIXED_POINT
    /* Another check in case of -ffast-math*/ // 浮点优化选项 -ffast-math：极大地提高浮点运算速度
    if (celt_isnan(x)) return 0;
#endif
    if (x < 0) {
        x = -x;
        sign = -1;
    }
    i = (int) floor(.5f + 25 * x);
    x -= .04f * i;
    y = tansig_table[i];
    dy = 1 - y * y;
    y = y + x * dy * (1 - y * x);
    return sign * y;
}